

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Action_Request_R_PDU.cpp
# Opt level: O1

void __thiscall KDIS::PDU::Action_Request_R_PDU::Encode(Action_Request_R_PDU *this)

{
  KDataStream *in_RSI;
  
  Encode((Action_Request_R_PDU *)
         &this[-1].super_Action_Request_PDU.super_Data_PDU.super_Comment_PDU.
          super_Simulation_Management_Header.super_Header.super_Header6.m_TimeStamp,in_RSI);
  return;
}

Assistant:

void Action_Request_R_PDU::Encode( KDataStream & stream ) const
{
    Simulation_Management_Header::Encode( stream );

    Reliability_Header::Encode( stream );

    stream << m_ui32RequestID
           << m_ui32ActionID
           << m_ui32NumFixedDatum
           << m_ui32NumVariableDatum;

    vector<FixDtmPtr>::const_iterator citrFixed = m_vFixedDatum.begin();
    vector<FixDtmPtr>::const_iterator citrFixedEnd = m_vFixedDatum.end();
    for( ; citrFixed != citrFixedEnd; ++citrFixed )
    {
        ( *citrFixed )->Encode( stream );
    }

    vector<VarDtmPtr>::const_iterator citrVar = m_vVariableDatum.begin();
    vector<VarDtmPtr>::const_iterator citrVarEnd = m_vVariableDatum.end();
    for( ; citrVar != citrVarEnd; ++citrVar )
    {
        ( *citrVar )->Encode( stream );
    }
}